

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.cpp
# Opt level: O0

void __thiscall lzham::task_pool::join(task_pool *this)

{
  bool bVar1;
  atomic32_t aVar2;
  task_pool *in_RDI;
  task tsk;
  task *in_stack_ffffffffffffffc8;
  task *in_stack_ffffffffffffffd8;
  tsstack<lzham::task_pool::task,_16U> *in_stack_ffffffffffffffe0;
  
  task::task((task *)&stack0xffffffffffffffd8);
  while (aVar2 = atomic_add32(&in_RDI->m_num_outstanding_tasks,0), 0 < aVar2) {
    bVar1 = tsstack<lzham::task_pool::task,_16U>::pop
                      (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
    if (bVar1) {
      process_task(in_RDI,in_stack_ffffffffffffffc8);
    }
    else {
      lzham_sleep((uint)((ulong)in_RDI >> 0x20));
    }
  }
  return;
}

Assistant:

void task_pool::join()
   {
      task tsk;
      while (atomic_add32(&m_num_outstanding_tasks, 0) > 0)
      {
         if (m_task_stack.pop(tsk))
         {
            process_task(tsk);
         }
         else
         {
            lzham_sleep(1);
         }
      }
   }